

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

uint64_t __thiscall
mkvmuxer::Segment::AddAudioTrack(Segment *this,int32_t sample_rate,int32_t channels,int32_t number)

{
  bool bVar1;
  Track *this_00;
  uint64 uVar2;
  
  this_00 = (Track *)operator_new(0x90,(nothrow_t *)&std::nothrow);
  if (this_00 == (Track *)0x0) {
    this_00 = (Track *)0x0;
  }
  else {
    this_00->_vptr_Track = (_func_int **)&PTR__AudioTrack_0013f9b8;
    this_00->codec_id_ = (char *)0x0;
    this_00->codec_private_ = (uint8_t *)0x0;
    this_00->language_ = (char *)0x0;
    this_00->max_block_additional_id_ = 0;
    this_00->name_ = (char *)0x0;
    this_00->number_ = 0;
    this_00->type_ = 0;
    uVar2 = MakeUID(&this->seed_);
    this_00->uid_ = uVar2;
    this_00->codec_delay_ = 0;
    this_00->seek_pre_roll_ = 0;
    this_00->default_duration_ = 0;
    this_00->codec_private_length_ = 0;
    *(undefined8 *)((long)&this_00->codec_private_length_ + 4) = 0;
    *(undefined8 *)((long)&this_00->content_encoding_entries_ + 4) = 0;
    this_00->_vptr_Track = (_func_int **)&PTR__AudioTrack_0013fa38;
    this_00[1]._vptr_Track = (_func_int **)0x0;
    this_00[1].codec_id_ = (char *)0x1;
    this_00[1].codec_private_ = (uint8_t *)0x0;
  }
  if (this_00 != (Track *)0x0) {
    this_00->type_ = 2;
    Track::set_codec_id(this_00,"A_VORBIS");
    this_00[1].codec_private_ = (uint8_t *)(double)sample_rate;
    this_00[1].codec_id_ = (char *)(long)channels;
    bVar1 = Tracks::AddTrack(&this->tracks_,this_00,number);
    if (bVar1) {
      return this_00->number_;
    }
    (*this_00->_vptr_Track[1])(this_00);
  }
  return 0;
}

Assistant:

uint64_t Segment::AddAudioTrack(int32_t sample_rate, int32_t channels,
                                int32_t number) {
  AudioTrack* const track = new (std::nothrow) AudioTrack(&seed_);  // NOLINT
  if (!track)
    return 0;

  track->set_type(Tracks::kAudio);
  track->set_codec_id(Tracks::kVorbisCodecId);
  track->set_sample_rate(sample_rate);
  track->set_channels(channels);

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return 0;
  }

  return track->number();
}